

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O3

bool testing::internal::
     TypeParameterizedTestSuite<google::protobuf::internal::WireFormatTest,_testing::internal::Templates<google::protobuf::internal::gtest_suite_WireFormatTest_::SerializeMessageSetVariousWaysAreEqual,_google::protobuf::internal::gtest_suite_WireFormatTest_::ParseMessageSet,_google::protobuf::internal::gtest_suite_WireFormatTest_::MessageSetUnknownButValidTypeId,_google::protobuf::internal::gtest_suite_WireFormatTest_::MessageSetInvalidTypeId,_google::protobuf::internal::gtest_suite_WireFormatTest_::MessageSetNonCanonInvalidTypeId,_google::protobuf::internal::gtest_suite_WireFormatTest_::CompatibleTypes,_google::protobuf::internal::gtest_suite_WireFormatTest_::LargeRecursionLimit,_google::protobuf::internal::gtest_suite_WireFormatTest_::ParseBrokenMessageSet,_google::protobuf::internal::gtest_suite_WireFormatTest_::ParseFailMalformedMessageSet,_google::protobuf::internal::gtest_suite_WireFormatTest_::ParseFailMalformedMessageSetReverseOrder,_google::protobuf::internal::gtest_suite_WireFormatTest_::ParseMessageSetWithAnyTagOrder,_google::protobuf::internal::gtest_suite_WireFormatTest_::ParseMessageSetWithDeepRecReverseOrder,_google::protobuf::internal::gtest_suite_WireFormatTest_::ParseMessageSetWithDuplicateTags,_google::protobuf::internal::gtest_suite_WireFormatTest_::RecursionLimit,_google::protobuf::internal::gtest_suite_WireFormatTest_::RepeatedScalarsDifferentTagSizes,_google::protobuf::internal::gtest_suite_WireFormatTest_::UnknownFieldRecursionLimit,_google::protobuf::internal::gtest_suite_WireFormatTest_::ZigZag,_google::protobuf::internal::gtest_suite_WireFormatTest_::MessageSetLargeTypeId>,_testing::internal::Types<proto2_unittest::TestAllTypes>_>
     ::Register(char *prefix,CodeLocation *code_location,TypedTestSuitePState *state,char *case_name
               ,char *test_names,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *type_names)

{
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  byte *pbVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  pointer pcVar5;
  bool bVar6;
  int iVar7;
  char *pcVar8;
  const_iterator cVar9;
  CodeLocation *pCVar10;
  undefined8 extraout_RAX;
  ulong uVar11;
  char *pcVar12;
  string test_name;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_f8;
  size_type local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_d8;
  char *local_d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_c8;
  key_type local_c0;
  CodeLocation local_a0;
  CodeLocation local_78;
  string local_50;
  
  local_d0 = prefix;
  local_c8 = type_names;
  RegisterTypeParameterizedTestSuiteInstantiation(case_name);
  pcVar8 = strchr(test_names,0x2c);
  if (pcVar8 == (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f8,test_names,(allocator<char> *)&local_50);
  }
  else {
    local_f8 = &local_e8;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,test_names,pcVar8);
  }
  local_c0._M_dataplus._M_p = (pointer)local_f8;
  if (local_f0 != 0) {
    pcVar8 = local_f8->_M_local_buf + local_f0;
    do {
      paVar2 = local_f8;
      iVar7 = isspace((uint)(byte)pcVar8[-1]);
      local_c0._M_dataplus._M_p = (pointer)paVar2;
      if (iVar7 == 0) break;
      pcVar12 = pcVar8 + -1;
      uVar11 = (long)pcVar12 - (long)paVar2;
      std::__cxx11::string::_M_erase((ulong)&local_f8,uVar11);
      pcVar8 = local_f8->_M_local_buf + uVar11;
      local_c0._M_dataplus._M_p = (pointer)local_f8;
    } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)pcVar12 != paVar2);
  }
  local_d8 = &local_c0.field_2;
  local_f8 = &local_e8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p == local_f8) {
    local_c0.field_2._8_8_ = local_e8._8_8_;
    local_c0._M_dataplus._M_p = (pointer)local_d8;
  }
  local_c0.field_2._M_allocated_capacity._1_7_ = local_e8._M_allocated_capacity._1_7_;
  local_c0.field_2._M_local_buf[0] = local_e8._M_local_buf[0];
  local_c0._M_string_length = local_f0;
  local_f0 = 0;
  local_e8._M_local_buf[0] = '\0';
  cVar9 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>,_std::less<void>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>_>
          ::find(&(state->registered_tests_)._M_t,&local_c0);
  p_Var1 = &(state->registered_tests_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)cVar9._M_node == p_Var1) {
    FormatFileLocation_abi_cxx11_
              (&local_50,(internal *)(code_location->file)._M_dataplus._M_p,
               (char *)(ulong)(uint)code_location->line,(int)p_Var1);
    TypeParameterizedTestSuite<google::protobuf::internal::WireFormatTest,testing::internal::Templates<google::protobuf::internal::gtest_suite_WireFormatTest_::SerializeMessageSetVariousWaysAreEqual,google::protobuf::internal::gtest_suite_WireFormatTest_::ParseMessageSet,google::protobuf::internal::gtest_suite_WireFormatTest_::MessageSetUnknownButValidTypeId,google::protobuf::internal::gtest_suite_WireFormatTest_::MessageSetInvalidTypeId,google::protobuf::internal::gtest_suite_WireFormatTest_::MessageSetNonCanonInvalidTypeId,google::protobuf::internal::gtest_suite_WireFormatTest_::CompatibleTypes,google::protobuf::internal::gtest_suite_WireFormatTest_::LargeRecursionLimit,google::protobuf::internal::gtest_suite_WireFormatTest_::ParseBrokenMessageSet,google::protobuf::internal::gtest_suite_WireFormatTest_::ParseFailMalformedMessageSet,google::protobuf::internal::gtest_suite_WireFormatTest_::ParseFailMalformedMessageSetReverseOrder,google::protobuf::internal::gtest_suite_WireFormatTest_::ParseMessageSetWithAnyTagOrder,google::protobuf::internal::gtest_suite_WireFormatTest_::ParseMessageSetWithDeepRecReverseOrder,google::protobuf::internal::gtest_suite_WireFormatTest_::ParseMessageSetWithDuplicateTags,google::protobuf::internal::gtest_suite_WireFormatTest_::RecursionLimit,google::protobuf::internal::gtest_suite_WireFormatTest_::RepeatedScalarsDifferentTagSizes,google::protobuf::internal::gtest_suite_WireFormatTest_::UnknownFieldRecursionLimit,google::protobuf::internal::gtest_suite_WireFormatTest_::ZigZag,google::protobuf::internal::gtest_suite_WireFormatTest_::MessageSetLargeTypeId>,testing::internal::Types<proto2_unittest::TestAllTypes>>
    ::Register();
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_d8->_M_allocated_capacity + 1);
    }
    _Unwind_Resume(extraout_RAX);
  }
  pCVar10 = TypedTestSuitePState::GetCodeLocation(state,&local_c0);
  paVar2 = &local_78.file.field_2;
  pcVar5 = (pCVar10->file)._M_dataplus._M_p;
  local_78.file._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_78,pcVar5,pcVar5 + (pCVar10->file)._M_string_length);
  local_78.line = pCVar10->line;
  TypeParameterizedTest<google::protobuf::internal::WireFormatTest,_testing::internal::TemplateSel<google::protobuf::internal::gtest_suite_WireFormatTest_::SerializeMessageSetVariousWaysAreEqual>,_testing::internal::Types<proto2_unittest::TestAllTypes>_>
  ::Register(local_d0,&local_78,case_name,test_names,0,local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.file._M_dataplus._M_p != paVar2) {
    operator_delete(local_78.file._M_dataplus._M_p,local_78.file.field_2._M_allocated_capacity + 1);
  }
  paVar4 = &local_a0.file.field_2;
  local_a0.file._M_dataplus._M_p = (code_location->file)._M_dataplus._M_p;
  paVar2 = &(code_location->file).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.file._M_dataplus._M_p == paVar2) {
    local_a0.file.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
    local_a0.file.field_2._8_8_ = *(undefined8 *)((long)&(code_location->file).field_2 + 8);
    local_a0.file._M_dataplus._M_p = (pointer)paVar4;
  }
  else {
    local_a0.file.field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  local_a0.file._M_string_length = (code_location->file)._M_string_length;
  (code_location->file)._M_dataplus._M_p = (pointer)paVar2;
  (code_location->file)._M_string_length = 0;
  (code_location->file).field_2._M_local_buf[0] = '\0';
  local_a0.line = code_location->line;
  pcVar8 = strchr(test_names,0x2c);
  if (pcVar8 == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    do {
      pbVar3 = (byte *)(pcVar8 + 1);
      pcVar8 = pcVar8 + 1;
      iVar7 = isspace((uint)*pbVar3);
    } while (iVar7 != 0);
  }
  bVar6 = TypeParameterizedTestSuite<google::protobuf::internal::WireFormatTest,_testing::internal::Templates<google::protobuf::internal::gtest_suite_WireFormatTest_::ParseMessageSet,_google::protobuf::internal::gtest_suite_WireFormatTest_::MessageSetUnknownButValidTypeId,_google::protobuf::internal::gtest_suite_WireFormatTest_::MessageSetInvalidTypeId,_google::protobuf::internal::gtest_suite_WireFormatTest_::MessageSetNonCanonInvalidTypeId,_google::protobuf::internal::gtest_suite_WireFormatTest_::CompatibleTypes,_google::protobuf::internal::gtest_suite_WireFormatTest_::LargeRecursionLimit,_google::protobuf::internal::gtest_suite_WireFormatTest_::ParseBrokenMessageSet,_google::protobuf::internal::gtest_suite_WireFormatTest_::ParseFailMalformedMessageSet,_google::protobuf::internal::gtest_suite_WireFormatTest_::ParseFailMalformedMessageSetReverseOrder,_google::protobuf::internal::gtest_suite_WireFormatTest_::ParseMessageSetWithAnyTagOrder,_google::protobuf::internal::gtest_suite_WireFormatTest_::ParseMessageSetWithDeepRecReverseOrder,_google::protobuf::internal::gtest_suite_WireFormatTest_::ParseMessageSetWithDuplicateTags,_google::protobuf::internal::gtest_suite_WireFormatTest_::RecursionLimit,_google::protobuf::internal::gtest_suite_WireFormatTest_::RepeatedScalarsDifferentTagSizes,_google::protobuf::internal::gtest_suite_WireFormatTest_::UnknownFieldRecursionLimit,_google::protobuf::internal::gtest_suite_WireFormatTest_::ZigZag,_google::protobuf::internal::gtest_suite_WireFormatTest_::MessageSetLargeTypeId>,_testing::internal::Types<proto2_unittest::TestAllTypes>_>
          ::Register(local_d0,&local_a0,state,case_name,pcVar8,local_c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0.file._M_dataplus._M_p != paVar4) {
    operator_delete(local_a0.file._M_dataplus._M_p,local_a0.file.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  return bVar6;
}

Assistant:

static bool Register(const char* prefix, CodeLocation code_location,
                       const TypedTestSuitePState* state, const char* case_name,
                       const char* test_names,
                       const std::vector<std::string>& type_names =
                           GenerateNames<DefaultNameGenerator, Types>()) {
    RegisterTypeParameterizedTestSuiteInstantiation(case_name);
    std::string test_name =
        StripTrailingSpaces(GetPrefixUntilComma(test_names));
    if (!state->TestExists(test_name)) {
      fprintf(stderr, "Failed to get code location for test %s.%s at %s.",
              case_name, test_name.c_str(),
              FormatFileLocation(code_location.file.c_str(), code_location.line)
                  .c_str());
      fflush(stderr);
      posix::Abort();
    }
    const CodeLocation& test_location = state->GetCodeLocation(test_name);

    typedef typename Tests::Head Head;

    // First, register the first test in 'Test' for each type in 'Types'.
    TypeParameterizedTest<Fixture, Head, Types>::Register(
        prefix, test_location, case_name, test_names, 0, type_names);

    // Next, recurses (at compile time) with the tail of the test list.
    return TypeParameterizedTestSuite<Fixture, typename Tests::Tail,
                                      Types>::Register(prefix,
                                                       std::move(code_location),
                                                       state, case_name,
                                                       SkipComma(test_names),
                                                       type_names);
  }